

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar7;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar9;
  FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *pFVar10;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar11;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar12;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar13;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar14;
  value_type vVar15;
  value_type vVar16;
  double dVar17;
  
  vVar15 = FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
           ::dx(&this->left_->fadexpr_,i);
  this_00 = &this->right_->fadexpr_;
  pFVar7 = (this_00->left_->fadexpr_).right_;
  iVar5 = (pFVar7->fadexpr_).left_.constant_;
  dVar1 = ((pFVar7->fadexpr_).right_)->val_;
  dVar2 = (this_00->left_->fadexpr_).left_.constant_;
  pFVar7 = (this_00->right_->fadexpr_).left_;
  iVar6 = (pFVar7->fadexpr_).left_.constant_;
  dVar3 = ((pFVar7->fadexpr_).right_)->val_;
  dVar4 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar16 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  pFVar8 = (this->left_->fadexpr_).left_;
  pFVar7 = (pFVar8->fadexpr_).left_;
  pFVar9 = (this->left_->fadexpr_).right_;
  pFVar10 = (pFVar9->fadexpr_).left_;
  pFVar11 = (this->right_->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).right_;
  pFVar13 = (this->right_->fadexpr_).right_;
  pFVar14 = (pFVar13->fadexpr_).left_;
  dVar17 = ((double)(pFVar14->fadexpr_).left_.constant_ + ((pFVar14->fadexpr_).right_)->val_ +
           ((pFVar13->fadexpr_).right_)->val_) *
           ((double)(pFVar12->fadexpr_).left_.constant_ + ((pFVar12->fadexpr_).right_)->val_) *
           (pFVar11->fadexpr_).left_.constant_;
  return (((double)iVar6 + dVar3 + dVar4) * ((double)iVar5 + dVar1) * dVar2 * vVar15 -
         (((double)(pFVar10->fadexpr_).left_.constant_ - ((pFVar10->fadexpr_).right_)->val_) +
         ((pFVar9->fadexpr_).right_)->val_) *
         (((double)(pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_) -
         ((pFVar8->fadexpr_).right_)->val_) * vVar16) / (dVar17 * dVar17);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}